

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::MaxMemorySetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  idx_t iVar1;
  BufferManager *pBVar2;
  string sStack_38;
  
  Value::ToString_abi_cxx11_(&sStack_38,input);
  iVar1 = DBConfig::ParseMemoryLimit(&sStack_38);
  (config->options).maximum_memory = iVar1;
  ::std::__cxx11::string::~string((string *)&sStack_38);
  if (db != (DatabaseInstance *)0x0) {
    pBVar2 = BufferManager::GetBufferManager(db);
    (*pBVar2->_vptr_BufferManager[0x18])(pBVar2,(config->options).maximum_memory);
  }
  return;
}

Assistant:

void MaxMemorySetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	config.options.maximum_memory = DBConfig::ParseMemoryLimit(input.ToString());
	if (db) {
		BufferManager::GetBufferManager(*db).SetMemoryLimit(config.options.maximum_memory);
	}
}